

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
               (CodedInputStream *input,int32_t *value)

{
  bool bVar1;
  int32_t iVar2;
  uint32_t local_24;
  int32_t *piStack_20;
  uint32_t temp;
  int32_t *value_local;
  CodedInputStream *input_local;
  
  piStack_20 = value;
  value_local = (int32_t *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_24);
  if (bVar1) {
    iVar2 = ZigZagDecode32(local_24);
    *piStack_20 = iVar2;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32_t, WireFormatLite::TYPE_SINT32>(
    io::CodedInputStream* input, int32_t* value) {
  uint32_t temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = ZigZagDecode32(temp);
  return true;
}